

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::
str<signed_char,char_const(&)[2],unsigned_char,char_const(&)[2],signed_char,char_const(&)[2],kj::CappedArray<char,3ul>>
          (String *__return_storage_ptr__,kj *this,char *params,char (*params_1) [2],uchar *params_2
          ,char (*params_3) [2],char *params_4,char (*params_5) [2],CappedArray<char,_3UL> *params_6
          )

{
  CappedArray<char,_5UL> CVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff48;
  CappedArray<char,_5UL> local_a0;
  ArrayPtr<const_char> local_90;
  CappedArray<char,_5UL> local_80;
  ArrayPtr<const_char> local_70;
  CappedArray<char,_5UL> local_60;
  ArrayPtr<const_char> local_50;
  size_t local_40;
  undefined4 local_38;
  char local_34;
  
  CVar1 = _::Stringifier::operator*((Stringifier *)&_::STR,(char)*this);
  local_40 = CVar1.currentSize;
  local_38 = CVar1.content._0_4_;
  local_34 = CVar1.content[4];
  local_a0._8_8_ = strlen(params);
  local_a0.currentSize = (size_t)params;
  CVar1 = _::Stringifier::operator*((Stringifier *)&_::STR,(*params_1)[0]);
  local_50.ptr = (char *)CVar1.currentSize;
  local_50.size_._0_4_ = CVar1.content._0_4_;
  local_50.size_._4_1_ = CVar1.content[4];
  local_60._8_8_ = strlen((char *)params_2);
  local_60.currentSize = (size_t)params_2;
  CVar1 = _::Stringifier::operator*((Stringifier *)&_::STR,(*params_3)[0]);
  local_70.ptr = (char *)CVar1.currentSize;
  local_70.size_._0_4_ = CVar1.content._0_4_;
  local_70.size_._4_1_ = CVar1.content[4];
  local_80._8_8_ = strlen(params_4);
  local_80.currentSize = (size_t)params_4;
  local_90.size_ = *(size_t *)params_5;
  local_90.ptr = params_5[4];
  _::
  concat<kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_40,&local_a0,&local_50,&local_60,&local_70,&local_80
             ,&local_90,in_stack_ffffffffffffff48);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}